

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O3

bool __thiscall
cmQtAutoGenerator::InfoT::GetStringConfig(InfoT *this,string *key,string *value,bool required)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  bool bVar3;
  Value *this_00;
  byte unaff_R13B;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  string_view message;
  string_view message_00;
  string configKey;
  string local_b0;
  string local_80;
  String local_60;
  size_type local_40;
  pointer local_38;
  
  local_60._M_string_length = (size_type)(key->_M_dataplus)._M_p;
  local_60._M_dataplus._M_p = (pointer)key->_M_string_length;
  paVar1 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (char *)0x1;
  local_b0.field_2._M_local_buf[0] = '_';
  local_60.field_2._M_allocated_capacity = 1;
  local_38 = (this->Gen_->InfoConfig_)._M_dataplus._M_p;
  local_40 = (this->Gen_->InfoConfig_)._M_string_length;
  views._M_len = 3;
  views._M_array = (iterator)&local_60;
  local_b0._M_string_length = (size_type)paVar1;
  local_60.field_2._8_8_ = paVar1;
  cmCatViews_abi_cxx11_(&local_80,views);
  this_00 = Json::Value::operator[](&this->Json_,&local_80);
  bVar2 = Json::Value::isNull(this_00);
  if (!bVar2) {
    bVar3 = Json::Value::isString(this_00);
    if (bVar3) {
      Json::Value::asString_abi_cxx11_(&local_60,this_00);
      std::__cxx11::string::operator=((string *)value,(string *)&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      unaff_R13B = 1;
      if ((!required) || (value->_M_string_length != 0)) goto LAB_0047d987;
      local_60._M_dataplus._M_p = (pointer)local_80._M_string_length;
      local_60._M_string_length = (size_type)local_80._M_dataplus._M_p;
      local_60.field_2._M_allocated_capacity = 10;
      local_60.field_2._8_8_ = (long)"Keyword is empty." + 7;
      views_00._M_len = 2;
      views_00._M_array = (iterator)&local_60;
      cmCatViews_abi_cxx11_(&local_b0,views_00);
      message._M_str = local_b0._M_dataplus._M_p;
      message._M_len = local_b0._M_string_length;
      LogError(this,this->Gen_->GenType_,message);
    }
    else {
      local_60._M_dataplus._M_p = (pointer)local_80._M_string_length;
      local_60._M_string_length = (size_type)local_80._M_dataplus._M_p;
      local_60.field_2._M_allocated_capacity = 0x11;
      local_60.field_2._8_8_ = (long)"JSON value for keyword is not a string." + 0x16;
      views_01._M_len = 2;
      views_01._M_array = (iterator)&local_60;
      cmCatViews_abi_cxx11_(&local_b0,views_01);
      message_00._M_str = local_b0._M_dataplus._M_p;
      message_00._M_len = local_b0._M_string_length;
      LogError(this,this->Gen_->GenType_,message_00);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,
                      CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                               local_b0.field_2._M_local_buf[0]) + 1);
    }
    unaff_R13B = 0;
  }
LAB_0047d987:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    unaff_R13B = GetString(this,key,value,required);
  }
  return (bool)(unaff_R13B & 1);
}

Assistant:

bool cmQtAutoGenerator::InfoT::GetStringConfig(std::string const& key,
                                               std::string& value,
                                               bool required) const
{
  { // Try config
    std::string const configKey = this->ConfigKey(key);
    Json::Value const& jval = this->Json_[configKey];
    if (!jval.isNull()) {
      if (!jval.isString()) {
        return this->LogError(cmStrCat(configKey, " is not a string."));
      }
      value = jval.asString();
      if (required && value.empty()) {
        return this->LogError(cmStrCat(configKey, " is empty."));
      }
      return true;
    }
  }
  // Try plain
  return this->GetString(key, value, required);
}